

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

int Gia_ManEquivSetColor_rec(Gia_Man_t *p,Gia_Obj_t *pObj,int fOdds)

{
  Gia_Rpr_t GVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Gia_Obj_t *pGVar8;
  int iVar9;
  
  iVar9 = 0;
  do {
    uVar7 = 0x80000000;
    if (fOdds == 0) {
      uVar7 = 0x40000000;
    }
    while( true ) {
      iVar5 = Gia_ObjId(p,pObj);
      GVar1 = p->pReprs[iVar5];
      bVar3 = GVar1._3_1_;
      p->pReprs[iVar5] = (Gia_Rpr_t)((uint)GVar1 | uVar7);
      bVar4 = bVar3 >> 6 & 1;
      if (fOdds != 0) {
        bVar4 = bVar3 >> 7;
      }
      if (bVar4 != 0) {
        return iVar9;
      }
      iVar5 = Gia_ObjIsRo(p,pObj);
      if (iVar5 == 0) break;
      iVar5 = Gia_ObjIsRo(p,pObj);
      if (iVar5 == 0) {
        __assert_fail("Gia_ObjIsRo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1cf,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar5 = p->vCos->nSize;
      iVar2 = p->vCis->nSize;
      iVar6 = Gia_ObjCioId(pObj);
      pGVar8 = Gia_ManCo(p,(iVar5 - iVar2) + iVar6);
      pObj = pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff);
      iVar9 = iVar9 + 1;
    }
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (uVar7 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar7 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEquiv.c"
                    ,0x2a4,"int Gia_ManEquivSetColor_rec(Gia_Man_t *, Gia_Obj_t *, int)");
    }
    iVar5 = Gia_ManEquivSetColor_rec(p,pObj + -(ulong)uVar7,fOdds);
    pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
    iVar9 = iVar9 + iVar5 + 1;
  } while( true );
}

Assistant:

int Gia_ManEquivSetColor_rec( Gia_Man_t * p, Gia_Obj_t * pObj, int fOdds )
{
    if ( Gia_ObjVisitColor( p, Gia_ObjId(p,pObj), fOdds ) )
        return 0;
    if ( Gia_ObjIsRo(p, pObj) )
        return 1 + Gia_ManEquivSetColor_rec( p, Gia_ObjFanin0(Gia_ObjRoToRi(p, pObj)), fOdds );
    assert( Gia_ObjIsAnd(pObj) );
    return 1 + Gia_ManEquivSetColor_rec( p, Gia_ObjFanin0(pObj), fOdds )
             + Gia_ManEquivSetColor_rec( p, Gia_ObjFanin1(pObj), fOdds );
}